

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void abgr_f32_to_bgr_888(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy
                        ,int width,int height)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 *puVar5;
  uint uVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  
  if (0 < height) {
    puVar5 = (undefined1 *)((long)dst + (long)(dy * dst_pitch) + (long)(dx * 3));
    pfVar7 = (float *)((long)src + (long)(sy * src_pitch) + (long)sx * 0x10);
    iVar8 = src_pitch + 0xf;
    if (-1 < src_pitch) {
      iVar8 = src_pitch;
    }
    iVar9 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar5 + width * 3;
        do {
          fVar2 = pfVar7[2];
          fVar3 = pfVar7[1];
          fVar4 = *pfVar7;
          *puVar5 = (char)(long)(fVar4 * 255.0);
          uVar6 = (uint)(long)(fVar4 * 255.0) |
                  (int)(long)(fVar3 * 255.0) << 8 | (int)(long)(fVar2 * 255.0) << 0x10;
          puVar5[1] = (char)(uVar6 >> 8);
          puVar5[2] = (char)(uVar6 >> 0x10);
          pfVar7 = pfVar7 + 4;
          puVar5 = puVar5 + 3;
        } while (puVar5 < puVar1);
      }
      puVar5 = puVar5 + (dst_pitch + width * -3);
      pfVar7 = pfVar7 + (long)((iVar8 >> 4) - width) * 4;
      iVar9 = iVar9 + 1;
    } while (iVar9 != height);
  }
  return;
}

Assistant:

static void abgr_f32_to_bgr_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const ALLEGRO_COLOR *src_ptr = (const ALLEGRO_COLOR *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 16 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_ABGR_F32_TO_BGR_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}